

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address-conversion.cc
# Opt level: O3

uint32_t num2len(uint32_t i)

{
  int iVar1;
  uint32_t uVar2;
  
  iVar1 = 0;
  if (i != 0) {
    for (; (i >> iVar1 & 1) == 0; iVar1 = iVar1 + 1) {
    }
  }
  uVar2 = 0x20 - iVar1;
  if (i == 0) {
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

uint32_t num2len(uint32_t i)
{
    uint32_t len = 0;
    while (i != 0)
    {
        i = i << 1;
        ++len;
    }
    return len;
}